

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void free_abbrevs(backtrace_state *state,abbrevs *abbrevs,backtrace_error_callback error_callback,
                 void *data)

{
  size_t size;
  long lVar1;
  ulong uVar2;
  
  if (abbrevs->num_abbrevs == 0) {
    size = 0;
  }
  else {
    lVar1 = 0x18;
    uVar2 = 0;
    do {
      tcmalloc_backtrace_free
                (state,*(void **)((long)&abbrevs->abbrevs->code + lVar1),
                 *(long *)((long)abbrevs->abbrevs + lVar1 + -8) << 4,error_callback,data);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (uVar2 < abbrevs->num_abbrevs);
    size = abbrevs->num_abbrevs << 5;
  }
  tcmalloc_backtrace_free(state,abbrevs->abbrevs,size,error_callback,data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = (abbrev *)0x0;
  return;
}

Assistant:

static void
free_abbrevs (struct backtrace_state *state, struct abbrevs *abbrevs,
	      backtrace_error_callback error_callback, void *data)
{
  size_t i;

  for (i = 0; i < abbrevs->num_abbrevs; ++i)
    backtrace_free (state, abbrevs->abbrevs[i].attrs,
		    abbrevs->abbrevs[i].num_attrs * sizeof (struct attr),
		    error_callback, data);
  backtrace_free (state, abbrevs->abbrevs,
		  abbrevs->num_abbrevs * sizeof (struct abbrev),
		  error_callback, data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = NULL;
}